

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t c4::yml::Parser::_count_nlines(csubstr src)

{
  size_t sVar1;
  size_t sVar2;
  basic_substring<const_char> local_20;
  
  sVar1 = basic_substring<const_char>::first_of(&local_20,'\n',0);
  sVar2 = 1;
  if (sVar1 != 0xffffffffffffffff) {
    do {
      sVar1 = basic_substring<const_char>::first_of(&local_20,'\n',sVar1 + 1);
      sVar2 = sVar2 + 1;
    } while (sVar1 != 0xffffffffffffffff);
  }
  return sVar2;
}

Assistant:

size_t Parser::_count_nlines(csubstr src)
{
    return 1 + src.count('\n');
}